

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DictionaryPropertyDescriptor.h
# Opt level: O1

void __thiscall
Js::DictionaryPropertyDescriptor<int>::ConvertToData(DictionaryPropertyDescriptor<int> *this)

{
  Flags FVar1;
  code *pcVar2;
  bool bVar3;
  int iVar4;
  undefined4 *puVar5;
  
  if ((this->flags & IsAccessor) != None) {
    if ((this->Getter == -1) || (this->Setter == -1)) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar5 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Types/DictionaryPropertyDescriptor.h"
                                  ,0xdc,"(this->Getter != NoSlots && this->Setter != NoSlots)",
                                  "this->Getter != NoSlots && this->Setter != NoSlots");
      if (!bVar3) goto LAB_00db7f27;
      *puVar5 = 0;
    }
    FVar1 = this->flags;
    this->flags = FVar1 & ~IsAccessor;
    if ((FVar1 & IsShadowed) == None) {
      if (this->Data != -1) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar5 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Types/DictionaryPropertyDescriptor.h"
                                    ,0xe4,"(this->Data == NoSlots)","this->Data == NoSlots");
        if (!bVar3) goto LAB_00db7f27;
        *puVar5 = 0;
      }
      this->Data = this->Getter;
      this->Getter = -1;
    }
    else if (this->Data == -1) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar5 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Types/DictionaryPropertyDescriptor.h"
                                  ,0xe0,"(this->Data != NoSlots)","this->Data != NoSlots");
      if (!bVar3) goto LAB_00db7f27;
      *puVar5 = 0;
    }
  }
  iVar4 = GetDataPropertyIndex<false>(this);
  if (iVar4 == -1) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Types/DictionaryPropertyDescriptor.h"
                                ,0xe9,"(GetDataPropertyIndex<false>() != NoSlots)",
                                "GetDataPropertyIndex<false>() != NoSlots");
    if (!bVar3) {
LAB_00db7f27:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar5 = 0;
  }
  return;
}

Assistant:

void DictionaryPropertyDescriptor<TPropertyIndex>::ConvertToData()
    {
        if (GetIsAccessor())
        {
            Assert(this->Getter != NoSlots && this->Setter != NoSlots);
            SetIsAccessor(false);
            if (GetIsShadowed())
            {
                Assert(this->Data != NoSlots);
            }
            else
            {
                Assert(this->Data == NoSlots);
                this->Data = this->Getter;
                this->Getter = NoSlots;
            }
        }
        Assert(GetDataPropertyIndex<false>() != NoSlots);
    }